

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O2

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,string *name,offset_in_Foo2_to_subr f)

{
  HSQUIRRELVM vm;
  undefined8 in_RCX;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  __shared_ptr<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2> local_50;
  HSQOBJECT local_40;
  
  vm = (HSQUIRRELVM)**(undefined8 **)this;
  std::__shared_ptr<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,this + 8);
  local_40._type = (*((local_50._M_ptr)->super_KlassImpBase)._vptr_KlassImpBase[3])();
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  if (f != 0) {
    pcStack_60 = std::_Function_handler<void_(Foo2_*),_void_(Foo2::*)()>::_M_invoke;
    local_68 = std::_Function_handler<void_(Foo2_*),_void_(Foo2::*)()>::_M_manager;
    local_78._M_unused._M_member_pointer = f;
    local_78._8_8_ = in_RCX;
  }
  detail::defun_local<void,Foo2*>(vm,&local_40,name,(function<void_(Foo2_*)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const string& name, F f) {
        detail::defun_local(
            vm_.handle(),
            imp_.lock()->get_klass_object(),
            name,
            to_function(f));
        return *this;
    }